

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::FilterMatchesTest
               (string *test_suite_name,string *test_name)

{
  bool bVar1;
  string *in_stack_00000118;
  PositiveAndNegativeUnitTestFilter *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  PositiveAndNegativeUnitTestFilter *in_stack_ffffffffffffffb0;
  
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (in_stack_00000120,in_stack_00000118);
  bVar1 = anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff40);
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)CONCAT44(in_stack_ffffffffffffff44,uVar2));
  return (bool)((byte)((uint)uVar2 >> 0x18) & 1);
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string& test_suite_name,
                                        const std::string& test_name) {
  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  return PositiveAndNegativeUnitTestFilter(GTEST_FLAG_GET(filter))
      .MatchesTest(test_suite_name, test_name);
}